

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

void readbyte(void)

{
  prev = c;
  c = l;
  l = fgetc((FILE *)f);
  switch(c) {
  case 9:
    column = (column + tabstop) - column % (uint)tabstop;
    break;
  case 10:
    if (l == 0xd) {
      prev = 10;
      c = 10;
      l = fgetc((FILE *)f);
    }
    line = line + 1;
    column = 0;
    break;
  case 0xb:
    line = (line & 0xfffffff8) + 8;
    goto LAB_00104e16;
  default:
    column = column + 1;
    break;
  case 0xd:
    if (l == 10) {
      prev = 0xd;
      c = 10;
      l = fgetc((FILE *)f);
    }
    line = line + 1;
LAB_00104e16:
    column = 0;
    c = 10;
  }
  return;
}

Assistant:

void readbyte()
{
    prev = c;
    c = l;
    l = fgetc(f);

    if (c == '\n')
    {
        if (l == '\r')
        {
            prev = c;
            c = '\n';
            l = fgetc(f);
        }
        ++line;
        column = 0;
    }
    else if (c == '\r')
    {
        if (l == '\n')
        {
            prev = c;
            c = l;
            l = fgetc(f);
        }
        ++line;
        column = 0;
        c = '\n';
    }
    else if (c == '\t')
    {
        column += tabstop - (column % tabstop);
    }
    else if (c == '\v')
    {
        line += 8 - (line % 8);
        column = 0;
        c = '\n';
    }
    else
        ++column;
}